

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_ops.cc
# Opt level: O1

void google::protobuf::internal::ReflectionOps::Clear(Message *message)

{
  int iVar1;
  undefined4 extraout_var;
  UnknownFieldSet *this;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  long *plVar2;
  
  iVar1 = (*(message->super_MessageLite)._vptr_MessageLite[0x16])();
  plVar2 = (long *)CONCAT44(extraout_var,iVar1);
  (**(code **)(*plVar2 + 0x80))(plVar2,message);
  this = (UnknownFieldSet *)(**(code **)(*plVar2 + 0x18))(plVar2,message);
  if (this->fields_ !=
      (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *)0x0
     ) {
    UnknownFieldSet::ClearFallback(this);
  }
  return;
}

Assistant:

void ReflectionOps::Clear(Message* message) {
  const Reflection* reflection = message->GetReflection();

  std::vector<const FieldDescriptor*> fields;
  reflection->ListFields(*message, &fields);
  for (int i = 0; i < fields.size(); i++) {
    reflection->ClearField(message, fields[i]);
  }

  reflection->MutableUnknownFields(message)->Clear();
}